

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_list(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node **siblings)

{
  lysp_node *plVar1;
  LY_ERR LVar2;
  lysp_node *parent_00;
  char *pcVar3;
  ly_ctx *local_138;
  ly_ctx *local_130;
  ly_ctx *local_128;
  ly_ctx *local_120;
  ly_ctx *local_108;
  char *local_100;
  ly_ctx *local_f0;
  ly_ctx *local_e8;
  ly_ctx *local_e0;
  LY_ERR ret___24;
  LY_ERR ret___23;
  LY_ERR ret___22;
  LY_ERR ret___21;
  LY_ERR ret___20;
  LY_ERR ret___19;
  LY_ERR ret___18;
  LY_ERR ret___17;
  LY_ERR ret___16;
  LY_ERR ret___15;
  LY_ERR ret___14;
  LY_ERR ret___13;
  LY_ERR ret___12;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_bool __loop_end;
  long *plStack_70;
  LY_ERR ret__;
  char **iter__;
  size_t offset__;
  char *p__;
  lysp_node_list *list;
  size_t sStack_48;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_node **pplStack_28;
  LY_ERR ret;
  lysp_node **siblings_local;
  lysp_node *parent_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_28 = siblings;
  siblings_local = &parent->parent;
  parent_local = (lysp_node *)ctx;
  parent_00 = (lysp_node *)calloc(1,0x90);
  if (parent_00 == (lysp_node *)0x0) {
    if (parent_local == (lysp_node *)0x0) {
      local_e0 = (ly_ctx *)0x0;
    }
    else {
      local_e0 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    ly_log(local_e0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_list");
    return LY_EMEM;
  }
  if (*pplStack_28 == (lysp_node *)0x0) {
    *pplStack_28 = parent_00;
  }
  else {
    plVar1 = *pplStack_28;
    while (plStack_70 = (long *)((long)plVar1 + (long)*pplStack_28 + (0x10 - (long)*pplStack_28)),
          *plStack_70 != 0) {
      plVar1 = (lysp_node *)*plStack_70;
    }
    *plStack_70 = (long)parent_00;
  }
  parent_00->nodetype = 0x10;
  parent_00->parent = (lysp_node *)siblings_local;
  LVar2 = get_argument((lysp_yang_ctx *)parent_local,Y_IDENTIF_ARG,(uint16_t *)0x0,
                       (char **)&word_len,&word,&stack0xffffffffffffffb8);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  if (word == (char *)0x0) {
    if (parent_local == (lysp_node *)0x0) {
      local_f0 = (ly_ctx *)0x0;
    }
    else {
      local_f0 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    if (sStack_48 == 0) {
      local_100 = "";
    }
    else {
      local_100 = (char *)word_len;
    }
    buf._4_4_ = lydict_insert(local_f0,local_100,sStack_48,&parent_00->name);
  }
  else {
    if (parent_local == (lysp_node *)0x0) {
      local_e8 = (ly_ctx *)0x0;
    }
    else {
      local_e8 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    buf._4_4_ = lydict_insert_zc(local_e8,(char *)word_len,&parent_00->name);
  }
  if (buf._4_4_ == LY_SUCCESS) {
    buf._4_4_ = 0;
    buf._4_4_ = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&list + 4),
                            (char **)&word_len,&stack0xffffffffffffffb8);
    if (buf._4_4_ == LY_SUCCESS) {
      if (list._4_4_ == LY_STMT_SYNTAX_SEMICOLON) {
        ret___2._3_1_ = 1;
        LVar2 = buf._4_4_;
      }
      else {
        if (list._4_4_ != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (parent_local == (lysp_node *)0x0) {
            local_108 = (ly_ctx *)0x0;
          }
          else {
            local_108 = *(ly_ctx **)
                         **(undefined8 **)
                           (parent_local->exts->argument +
                           (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
          }
          pcVar3 = lyplg_ext_stmt2str(list._4_4_);
          ly_vlog(local_108,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar3);
          return LY_EVALID;
        }
        LVar2 = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&list + 4),
                            (char **)&word_len,&stack0xffffffffffffffb8);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        ret___2._3_1_ = list._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE;
        LVar2 = LY_SUCCESS;
      }
      while (buf._4_4_ = LVar2, !(bool)ret___2._3_1_) {
        if (list._4_4_ == LY_STMT_NOTIFICATION) {
          if (*(byte *)(*(long *)(parent_local->exts->argument +
                                 (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8) +
                       0x78) < 2) {
            if (parent_local == (lysp_node *)0x0) {
              local_130 = (ly_ctx *)0x0;
            }
            else {
              local_130 = *(ly_ctx **)
                           **(undefined8 **)
                             (parent_local->exts->argument +
                             (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
            }
            ly_vlog(local_130,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                    ,"notification","list");
            return LY_EVALID;
          }
          LVar2 = parse_notif((lysp_yang_ctx *)parent_local,parent_00,
                              (lysp_node_notif **)&parent_00[1].exts);
        }
        else if (list._4_4_ == LY_STMT_ACTION) {
          if (*(byte *)(*(long *)(parent_local->exts->argument +
                                 (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8) +
                       0x78) < 2) {
            if (parent_local == (lysp_node *)0x0) {
              local_128 = (ly_ctx *)0x0;
            }
            else {
              local_128 = *(ly_ctx **)
                           **(undefined8 **)
                             (parent_local->exts->argument +
                             (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
            }
            ly_vlog(local_128,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                    ,"action","list");
            return LY_EVALID;
          }
          LVar2 = parse_action((lysp_yang_ctx *)parent_local,parent_00,
                               (lysp_node_action **)&parent_00[1].iffeatures);
        }
        else {
          if (list._4_4_ == LY_STMT_ANYDATA) {
            if (*(byte *)(*(long *)(parent_local->exts->argument +
                                   (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8) +
                         0x78) < 2) {
              if (parent_local == (lysp_node *)0x0) {
                local_120 = (ly_ctx *)0x0;
              }
              else {
                local_120 = *(ly_ctx **)
                             **(undefined8 **)
                               (parent_local->exts->argument +
                               (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
              }
              ly_vlog(local_120,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                      ,"anydata","list");
              return LY_EVALID;
            }
          }
          else if (list._4_4_ != LY_STMT_ANYXML) {
            if (list._4_4_ == LY_STMT_CHOICE) {
              LVar2 = parse_choice((lysp_yang_ctx *)parent_local,parent_00,
                                   (lysp_node **)&parent_00[1].ref);
            }
            else if (list._4_4_ == LY_STMT_CONTAINER) {
              LVar2 = parse_container((lysp_yang_ctx *)parent_local,parent_00,
                                      (lysp_node **)&parent_00[1].ref);
            }
            else if (list._4_4_ == LY_STMT_GROUPING) {
              LVar2 = parse_grouping((lysp_yang_ctx *)parent_local,parent_00,
                                     (lysp_node_grp **)&parent_00[1].dsc);
            }
            else if (list._4_4_ == LY_STMT_LEAF) {
              LVar2 = parse_leaf((lysp_yang_ctx *)parent_local,parent_00,
                                 (lysp_node **)&parent_00[1].ref);
            }
            else if (list._4_4_ == LY_STMT_LEAF_LIST) {
              LVar2 = parse_leaflist((lysp_yang_ctx *)parent_local,parent_00,
                                     (lysp_node **)&parent_00[1].ref);
            }
            else if (list._4_4_ == LY_STMT_LIST) {
              LVar2 = parse_list((lysp_yang_ctx *)parent_local,parent_00,
                                 (lysp_node **)&parent_00[1].ref);
            }
            else if (list._4_4_ == LY_STMT_USES) {
              LVar2 = parse_uses((lysp_yang_ctx *)parent_local,parent_00,
                                 (lysp_node **)&parent_00[1].ref);
            }
            else if (list._4_4_ == LY_STMT_CONFIG) {
              LVar2 = parse_config((lysp_yang_ctx *)parent_local,&parent_00->flags,&parent_00->exts)
              ;
            }
            else if (list._4_4_ == LY_STMT_DESCRIPTION) {
              LVar2 = parse_text_field((lysp_yang_ctx *)parent_local,parent_00->dsc,
                                       LY_STMT_DESCRIPTION,0,&parent_00->dsc,Y_STR_ARG,
                                       (uint16_t *)0x0,&parent_00->exts);
            }
            else if (list._4_4_ == LY_STMT_EXTENSION_INSTANCE) {
              LVar2 = parse_ext((lysp_yang_ctx *)parent_local,(char *)word_len,sStack_48,parent_00,
                                LY_STMT_LIST,0,&parent_00->exts);
            }
            else if (list._4_4_ == LY_STMT_IF_FEATURE) {
              LVar2 = parse_qnames((lysp_yang_ctx *)parent_local,LY_STMT_IF_FEATURE,
                                   &parent_00->iffeatures,Y_STR_ARG,&parent_00->exts);
            }
            else if (list._4_4_ == LY_STMT_KEY) {
              LVar2 = parse_text_field((lysp_yang_ctx *)parent_local,parent_00,LY_STMT_KEY,0,
                                       (char **)&parent_00[1].next,Y_STR_ARG,(uint16_t *)0x0,
                                       &parent_00->exts);
            }
            else if (list._4_4_ == LY_STMT_MAX_ELEMENTS) {
              LVar2 = parse_maxelements((lysp_yang_ctx *)parent_local,
                                        (uint32_t *)&parent_00[2].field_0xc,&parent_00->flags,
                                        &parent_00->exts);
            }
            else if (list._4_4_ == LY_STMT_MIN_ELEMENTS) {
              LVar2 = parse_minelements((lysp_yang_ctx *)parent_local,
                                        (uint32_t *)&parent_00[2].nodetype,&parent_00->flags,
                                        &parent_00->exts);
            }
            else if (list._4_4_ == LY_STMT_MUST) {
              LVar2 = parse_restrs((lysp_yang_ctx *)parent_local,LY_STMT_MUST,
                                   (lysp_restr **)(parent_00 + 1));
            }
            else if (list._4_4_ == LY_STMT_ORDERED_BY) {
              LVar2 = parse_orderedby((lysp_yang_ctx *)parent_local,parent_00);
            }
            else if (list._4_4_ == LY_STMT_REFERENCE) {
              LVar2 = parse_text_field((lysp_yang_ctx *)parent_local,parent_00->ref,
                                       LY_STMT_REFERENCE,0,&parent_00->ref,Y_STR_ARG,(uint16_t *)0x0
                                       ,&parent_00->exts);
            }
            else if (list._4_4_ == LY_STMT_STATUS) {
              LVar2 = parse_status((lysp_yang_ctx *)parent_local,&parent_00->flags,&parent_00->exts)
              ;
            }
            else if (list._4_4_ == LY_STMT_TYPEDEF) {
              LVar2 = parse_typedef((lysp_yang_ctx *)parent_local,parent_00,
                                    (lysp_tpdf **)&parent_00[1].name);
            }
            else if (list._4_4_ == LY_STMT_UNIQUE) {
              LVar2 = parse_qnames((lysp_yang_ctx *)parent_local,LY_STMT_UNIQUE,
                                   (lysp_qname **)(parent_00 + 2),Y_STR_ARG,&parent_00->exts);
            }
            else {
              if (list._4_4_ != LY_STMT_WHEN) {
                if (parent_local == (lysp_node *)0x0) {
                  local_138 = (ly_ctx *)0x0;
                }
                else {
                  local_138 = *(ly_ctx **)
                               **(undefined8 **)
                                 (parent_local->exts->argument +
                                 (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
                }
                pcVar3 = lyplg_ext_stmt2str(list._4_4_);
                ly_vlog(local_138,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,"list");
                return LY_EVALID;
              }
              LVar2 = parse_when((lysp_yang_ctx *)parent_local,(lysp_when **)&parent_00[1].nodetype)
              ;
            }
            goto joined_r0x001c6e2a;
          }
          LVar2 = parse_any((lysp_yang_ctx *)parent_local,list._4_4_,parent_00,
                            (lysp_node **)&parent_00[1].ref);
        }
joined_r0x001c6e2a:
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        buf._4_4_ = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&list + 4),
                                (char **)&word_len,&stack0xffffffffffffffb8);
        if (buf._4_4_ != LY_SUCCESS) {
          return buf._4_4_;
        }
        LVar2 = LY_SUCCESS;
        if (list._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE) {
          if ((parent_00->exts != (lysp_ext_instance *)0x0) &&
             (LVar2 = ly_set_add((ly_set *)&(parent_local[1].parent)->ref,parent_00->exts,'\x01',
                                 (uint32_t *)0x0), LVar2 != LY_SUCCESS)) {
            return LVar2;
          }
          buf._4_4_ = LVar2;
          ret___2._3_1_ = true;
          LVar2 = buf._4_4_;
        }
      }
    }
  }
  return buf._4_4_;
}

Assistant:

LY_ERR
parse_list(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node **siblings)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_list *list;

    /* create new list structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, list, next, LY_EMEM);
    list->nodetype = LYS_LIST;
    list->parent = parent;

    /* get name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, list->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &list->flags, &list->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, list->dsc, LY_STMT_DESCRIPTION, 0, &list->dsc, Y_STR_ARG, NULL, &list->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &list->iffeatures, Y_STR_ARG, &list->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, list->ref, LY_STMT_REFERENCE, 0, &list->ref, Y_STR_ARG, NULL, &list->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &list->flags, &list->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(parse_when(ctx, &list->when));
            break;
        case LY_STMT_KEY:
            LY_CHECK_RET(parse_text_field(ctx, list, LY_STMT_KEY, 0, &list->key, Y_STR_ARG, NULL, &list->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(parse_maxelements(ctx, &list->max, &list->flags, &list->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(parse_minelements(ctx, &list->min, &list->flags, &list->exts));
            break;
        case LY_STMT_ORDERED_BY:
            LY_CHECK_RET(parse_orderedby(ctx, &list->node));
            break;
        case LY_STMT_UNIQUE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_UNIQUE, &list->uniques, Y_STR_ARG, &list->exts));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "list");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, (struct lysp_node *)list, &list->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, (struct lysp_node *)list, &list->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, (struct lysp_node *)list, &list->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, (struct lysp_node *)list, &list->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, (struct lysp_node *)list, &list->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, (struct lysp_node *)list, &list->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, (struct lysp_node *)list, &list->child));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, (struct lysp_node *)list, &list->typedefs));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(parse_restrs(ctx, kw, &list->musts));
            break;
        case LY_STMT_ACTION:
            PARSER_CHECK_STMTVER2_RET(ctx, "action", "list");
            LY_CHECK_RET(parse_action(ctx, (struct lysp_node *)list, &list->actions));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, (struct lysp_node *)list, &list->groupings));
            break;
        case LY_STMT_NOTIFICATION:
            PARSER_CHECK_STMTVER2_RET(ctx, "notification", "list");
            LY_CHECK_RET(parse_notif(ctx, (struct lysp_node *)list, &list->notifs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, list, LY_STMT_LIST, 0, &list->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "list");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, list->exts, ret, cleanup);
    }

cleanup:
    return ret;
}